

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  uint64_t _a;
  uint64_t _b;
  uint64_t _g;
  uint64_t _r;
  long local_98;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar9 = source->width;
  lVar11 = source->height;
  if (w < 0) {
    w = lVar9;
  }
  if (h < 0) {
    h = lVar11;
  }
  uVar6 = sx >> 0x3f & sx;
  lVar3 = x - uVar6;
  lVar10 = 0;
  if (sx < 1) {
    sx = lVar10;
  }
  uVar7 = sy >> 0x3f & sy;
  lVar2 = y - uVar7;
  if (sy < 1) {
    sy = lVar10;
  }
  lVar4 = 0;
  if (0 < lVar3) {
    lVar4 = lVar3;
  }
  if (-1 < lVar3) {
    lVar3 = lVar10;
  }
  uVar6 = uVar6 + w + lVar3;
  lVar3 = sx - lVar3;
  lVar5 = 0;
  if (0 < lVar2) {
    lVar5 = lVar2;
  }
  if (-1 < lVar2) {
    lVar2 = lVar10;
  }
  uVar8 = uVar7 + h + lVar2;
  lVar2 = sy - lVar2;
  uVar7 = lVar9 - lVar3;
  if ((long)(uVar6 + lVar3) <= lVar9) {
    uVar7 = uVar6;
  }
  uVar6 = lVar11 - lVar2;
  if ((long)(uVar8 + lVar2) <= lVar11) {
    uVar6 = uVar8;
  }
  uVar8 = this->width - lVar4;
  if ((long)(uVar7 + lVar4) <= this->width) {
    uVar8 = uVar7;
  }
  uVar7 = this->height - lVar5;
  if ((long)(uVar6 + lVar5) <= this->height) {
    uVar7 = uVar6;
  }
  bVar12 = -1 < (long)(uVar8 | uVar7);
  if ((bVar12) && (0 < (long)uVar7)) {
    local_98 = 0;
    do {
      if (0 < (long)uVar8 && -1 < (long)uVar7) {
        lVar10 = 1;
        lVar9 = lVar4;
        lVar11 = lVar3;
        do {
          read_pixel(source,lVar11,local_98 + lVar2,&local_38,&local_40,&local_48,&local_50);
          if (local_48 != b || (local_40 != g || local_38 != r)) {
            write_pixel(this,lVar9,lVar5 + local_98,local_38,local_40,local_48,local_50);
          }
          bVar1 = lVar10 < (long)uVar8;
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 1;
        } while (bVar12 && bVar1);
      }
      local_98 = local_98 + 1;
    } while (bVar12 && local_98 < (long)uVar7);
  }
  return;
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
      if (r != _r || g != _g || b != _b) {
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}